

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O3

void __thiscall tcu::Matrix<tcu::Interval,_3,_4>::Matrix(Matrix<tcu::Interval,_3,_4> *this)

{
  bool *pbVar1;
  double *pdVar2;
  long lVar3;
  Vector<tcu::Interval,_3> *pVVar4;
  long lVar5;
  undefined8 *puVar6;
  long lVar7;
  int i;
  uint uVar8;
  undefined1 auStack_50 [8];
  undefined8 local_48 [9];
  
  lVar3 = 0;
  pVVar4 = (Vector<tcu::Interval,_3> *)this;
  do {
    lVar5 = 8;
    do {
      *(undefined1 *)
       ((long)((Vector<tcu::Vector<tcu::Interval,_3>,_4> *)pVVar4->m_data)->m_data[0].m_data +
       lVar5 + -8) = 0;
      pbVar1 = &((Vector<tcu::Vector<tcu::Interval,_3>,_4> *)pVVar4->m_data)->m_data[0].m_data[0].
                m_hasNaN + lVar5;
      *(undefined8 *)pbVar1 = 0x7ff0000000000000;
      *(double *)(pbVar1 + 8) = -INFINITY;
      lVar5 = lVar5 + 0x18;
    } while (lVar5 != 0x50);
    lVar5 = 8;
    do {
      *(undefined1 *)
       ((long)((Vector<tcu::Vector<tcu::Interval,_3>,_4> *)pVVar4->m_data)->m_data[0].m_data +
       lVar5 + -8) = 0;
      pbVar1 = &((Vector<tcu::Vector<tcu::Interval,_3>,_4> *)pVVar4->m_data)->m_data[0].m_data[0].
                m_hasNaN + lVar5;
      *(undefined8 *)pbVar1 = 0x7ff0000000000000;
      *(double *)(pbVar1 + 8) = -INFINITY;
      lVar5 = lVar5 + 0x18;
    } while (lVar5 != 0x50);
    lVar3 = lVar3 + 0x48;
    pVVar4 = pVVar4 + 1;
  } while (lVar3 != 0x120);
  lVar3 = 0;
  do {
    lVar5 = 8;
    do {
      auStack_50[lVar5] = 0;
      *(undefined8 *)((long)local_48 + lVar5) = 0x7ff0000000000000;
      *(undefined8 *)((long)local_48 + lVar5 + 8) = 0xfff0000000000000;
      lVar5 = lVar5 + 0x18;
    } while (lVar5 != 0x50);
    lVar5 = 8;
    do {
      auStack_50[lVar5] = 0;
      *(undefined8 *)((long)local_48 + lVar5) = 0x7ff0000000000000;
      *(undefined8 *)((long)local_48 + lVar5 + 8) = 0xfff0000000000000;
      lVar5 = lVar5 + 0x18;
    } while (lVar5 != 0x50);
    puVar6 = local_48;
    pVVar4 = (this->m_data).m_data + lVar3;
    for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
      *(undefined8 *)pVVar4->m_data = *puVar6;
      puVar6 = puVar6 + 1;
      pVVar4 = (Vector<tcu::Interval,_3> *)&pVVar4->m_data[0].m_lo;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  pdVar2 = &(this->m_data).m_data[0].m_data[0].m_hi;
  lVar3 = 0;
  lVar5 = 0;
  do {
    lVar7 = 0;
    do {
      uVar8 = 0x3ff00000;
      if (lVar3 != lVar7) {
        uVar8 = 0;
      }
      *(undefined1 *)((long)pdVar2 + lVar7 + -0x10) = 0;
      *(ulong *)((long)pdVar2 + lVar7 + -8) = (ulong)uVar8 << 0x20;
      *(ulong *)((long)pdVar2 + lVar7) = (ulong)uVar8 << 0x20;
      lVar7 = lVar7 + 0x48;
    } while (lVar7 != 0x120);
    lVar5 = lVar5 + 1;
    lVar3 = lVar3 + 0x48;
    pdVar2 = pdVar2 + 3;
  } while (lVar5 != 3);
  return;
}

Assistant:

Matrix<T, Rows, Cols>::Matrix (void)
{
	for (int row = 0; row < Rows; row++)
		for (int col = 0; col < Cols; col++)
			(*this)(row, col) = (row == col) ? T(1) : T(0);
}